

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O3

QRect __thiscall QWidgetEffectSourcePrivate::deviceRect(QWidgetEffectSourcePrivate *this)

{
  QWidgetData *pQVar1;
  undefined1 auVar2 [16];
  QWidget *pQVar3;
  
  pQVar3 = this->m_widget;
  do {
    pQVar1 = pQVar3->data;
    pQVar3 = *(QWidget **)(*(long *)&pQVar3->field_0x8 + 0x10);
    if (pQVar3 == (QWidget *)0x0) break;
  } while (((pQVar1->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
  auVar2._4_4_ = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
  auVar2._0_4_ = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  auVar2._8_8_ = 0;
  return (QRect)(auVar2 << 0x40);
}

Assistant:

QRect deviceRect() const override
    { return m_widget->window()->rect(); }